

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

void Gia_ManAddDom(Gia_Man_t *p,Gia_Obj_t *pObj,int iDom0)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  
  iVar1 = Gia_ObjDom(p,pObj);
  if (iVar1 != -1) {
    iVar1 = Gia_ObjDom(p,pObj);
    do {
      while (iDom0 <= iVar1) {
        if (iVar1 <= iDom0) {
          if (iDom0 != iVar1) {
            __assert_fail("iDom0 == iDom1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                          ,0x50,"void Gia_ManAddDom(Gia_Man_t *, Gia_Obj_t *, int)");
          }
          goto LAB_00494406;
        }
        pGVar3 = Gia_ManObj(p,iDom0);
        iVar2 = Gia_ObjDom(p,pGVar3);
        bVar4 = iVar2 == iDom0;
        iDom0 = iVar2;
        if (bVar4) goto LAB_004943f9;
      }
      pGVar3 = Gia_ManObj(p,iVar1);
      iVar2 = Gia_ObjDom(p,pGVar3);
      bVar4 = iVar2 != iVar1;
      iVar1 = iVar2;
    } while (bVar4);
LAB_004943f9:
    iDom0 = Gia_ObjId(p,pObj);
  }
LAB_00494406:
  Gia_ObjSetDom(p,pObj,iDom0);
  return;
}

Assistant:

void Gia_ManAddDom( Gia_Man_t * p, Gia_Obj_t * pObj, int iDom0 )
{
    int iDom1, iDomNext;
    if ( Gia_ObjDom(p, pObj) == -1 )
    {
        Gia_ObjSetDom( p, pObj, iDom0 );
        return;
    }
    iDom1 = Gia_ObjDom( p, pObj );
    while ( 1 )
    {
        if ( iDom0 > iDom1 )
        {
            iDomNext = Gia_ObjDom( p, Gia_ManObj(p, iDom1) );
            if ( iDomNext == iDom1 )
                break;
            iDom1 = iDomNext;
            continue;
        }
        if ( iDom1 > iDom0 )
        {
            iDomNext = Gia_ObjDom( p, Gia_ManObj(p, iDom0) );
            if ( iDomNext == iDom0 )
                break;
            iDom0 = iDomNext;
            continue;
        }
        assert( iDom0 == iDom1 );
        Gia_ObjSetDom( p, pObj, iDom0 );
        return;
    }
    Gia_ObjSetDom( p, pObj, Gia_ObjId(p, pObj) );
}